

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filterintra_sse4.c
# Opt level: O0

void av1_filter_intra_predictor_sse4_1
               (uint8_t *dst,ptrdiff_t stride,TX_SIZE tx_size,uint8_t *above,uint8_t *left,int mode)

{
  int bh;
  int bw;
  int in_stack_00000098;
  int in_stack_0000009c;
  void *in_stack_000000a0;
  void *in_stack_000000a8;
  ptrdiff_t in_stack_000000b0;
  void *in_stack_000000b8;
  int in_stack_00000220;
  
  filter_intra_predictor_sse4_1
            (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,
             in_stack_0000009c,in_stack_00000098,in_stack_00000220);
  return;
}

Assistant:

void av1_filter_intra_predictor_sse4_1(uint8_t *dst, ptrdiff_t stride,
                                       TX_SIZE tx_size, const uint8_t *above,
                                       const uint8_t *left, int mode) {
  const int bw = tx_size_wide[tx_size];
  const int bh = tx_size_high[tx_size];
  filter_intra_predictor_sse4_1(dst, stride, above, left, mode, bw, bh);
}